

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O1

int64_t google::protobuf::util::TimeUtil::DurationToNanoseconds(Duration *duration)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  LogMessageFatal aLStack_28 [16];
  
  lVar2 = (duration->field_0)._impl_.seconds_;
  if (((lVar2 + 0x4979cb9e00U < 0x92f3973c01) &&
      (iVar1 = (duration->field_0)._impl_.nanos_, iVar1 + 999999999U < 1999999999)) &&
     (lVar2 < 1 || -1 < iVar1)) {
    bVar3 = iVar1 < 1 || -1 < lVar2;
  }
  else {
    bVar3 = false;
  }
  if (bVar3) {
    return (long)(duration->field_0)._impl_.nanos_ +
           (duration->field_0)._impl_.seconds_ * 1000000000;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/util/time_util.cc"
             ,0x134,0x19,"IsDurationValid(duration)");
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (aLStack_28,0x26,"Duration is outside of the valid range");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
}

Assistant:

int64_t TimeUtil::DurationToNanoseconds(const Duration& duration) {
  ABSL_DCHECK(IsDurationValid(duration))
      << "Duration is outside of the valid range";
  return duration.seconds() * kNanosPerSecond + duration.nanos();
}